

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::NewLine(FlowBuffer *this)

{
  FlowBuffer *in_RDI;
  FlowBuffer *unaff_retaddr;
  
  NewMessage(unaff_retaddr);
  in_RDI->mode_ = CR_OR_LF_1;
  in_RDI->frame_length_ = 0;
  in_RDI->chunked_ = false;
  in_RDI->have_pending_request_ = true;
  if (in_RDI->state_ == FRAME_0) {
    ResetLineState(in_RDI);
  }
  MarkOrCopyLine(in_RDI);
  return;
}

Assistant:

void FlowBuffer::NewLine()
	{
	FlowBuffer::NewMessage();
	mode_ = LINE_MODE;
	frame_length_ = 0;
	chunked_ = false;
	have_pending_request_ = true;
	if ( state_ == FRAME_0 )
		ResetLineState();
	MarkOrCopyLine();
	}